

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result * validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetworkRegressor>
                   (Result *__return_storage_ptr__,NeuralNetworkRegressor *nn)

{
  bool bVar1;
  Result local_a8;
  Result local_80;
  Result local_48;
  undefined1 local_19;
  NeuralNetworkRegressor *local_18;
  NeuralNetworkRegressor *nn_local;
  Result *r;
  
  local_19 = 0;
  local_18 = nn;
  nn_local = (NeuralNetworkRegressor *)__return_storage_ptr__;
  CoreML::Result::Result(__return_storage_ptr__);
  validateUpdatableLayerSupport<CoreML::Specification::NeuralNetworkRegressor>(&local_48,local_18);
  CoreML::Result::operator=(__return_storage_ptr__,&local_48);
  CoreML::Result::~Result(&local_48);
  bVar1 = CoreML::Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateLayerAndLossLayerNamesCollisions<CoreML::Specification::NeuralNetworkRegressor>
              (&local_80,local_18);
    CoreML::Result::operator=(__return_storage_ptr__,&local_80);
    CoreML::Result::~Result(&local_80);
    bVar1 = CoreML::Result::good(__return_storage_ptr__);
    if (bVar1) {
      isTrainingConfigurationSupported<CoreML::Specification::NeuralNetworkRegressor>
                (&local_a8,local_18);
      CoreML::Result::operator=(__return_storage_ptr__,&local_a8);
      CoreML::Result::~Result(&local_a8);
      CoreML::Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateUpdatableNeuralNetwork(const T& nn) {
    
    Result r;

    r = validateUpdatableLayerSupport(nn);
    if (!r.good()) {return r;}
    
    r = validateLayerAndLossLayerNamesCollisions(nn);
    if (!r.good()) {return r;}

    r = isTrainingConfigurationSupported(nn);
    if (!r.good()) {return r;}
    
    return r;
}